

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_illegal_func_names_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  undefined1 local_1043;
  undefined1 local_1042;
  undefined1 local_1041;
  undefined1 *local_1040 [2];
  undefined1 local_1030 [16];
  undefined1 *local_1020 [2];
  undefined1 local_1010 [16];
  undefined1 *local_1000 [2];
  undefined1 local_ff0 [16];
  undefined1 *local_fe0 [2];
  undefined1 local_fd0 [16];
  undefined1 *local_fc0 [2];
  undefined1 local_fb0 [16];
  undefined1 *local_fa0 [2];
  undefined1 local_f90 [16];
  undefined1 *local_f80 [2];
  undefined1 local_f70 [16];
  undefined1 *local_f60 [2];
  undefined1 local_f50 [16];
  undefined1 *local_f40 [2];
  undefined1 local_f30 [16];
  undefined1 *local_f20 [2];
  undefined1 local_f10 [16];
  undefined1 *local_f00 [2];
  undefined1 local_ef0 [16];
  undefined1 *local_ee0 [2];
  undefined1 local_ed0 [16];
  undefined1 *local_ec0 [2];
  undefined1 local_eb0 [16];
  undefined1 *local_ea0 [2];
  undefined1 local_e90 [16];
  undefined1 *local_e80 [2];
  undefined1 local_e70 [16];
  undefined1 *local_e60 [2];
  undefined1 local_e50 [16];
  undefined1 *local_e40 [2];
  undefined1 local_e30 [16];
  undefined1 *local_e20 [2];
  undefined1 local_e10 [16];
  undefined1 *local_e00 [2];
  undefined1 local_df0 [16];
  undefined1 *local_de0 [2];
  undefined1 local_dd0 [16];
  undefined1 *local_dc0 [2];
  undefined1 local_db0 [16];
  undefined1 *local_da0 [2];
  undefined1 local_d90 [16];
  undefined1 *local_d80 [2];
  undefined1 local_d70 [16];
  undefined1 *local_d60 [2];
  undefined1 local_d50 [16];
  undefined1 *local_d40 [2];
  undefined1 local_d30 [16];
  undefined1 *local_d20 [2];
  undefined1 local_d10 [16];
  undefined1 *local_d00 [2];
  undefined1 local_cf0 [16];
  undefined1 *local_ce0 [2];
  undefined1 local_cd0 [16];
  undefined1 *local_cc0 [2];
  undefined1 local_cb0 [16];
  undefined1 *local_ca0 [2];
  undefined1 local_c90 [16];
  undefined1 *local_c80 [2];
  undefined1 local_c70 [16];
  undefined1 *local_c60 [2];
  undefined1 local_c50 [16];
  undefined1 *local_c40 [2];
  undefined1 local_c30 [16];
  undefined1 *local_c20 [2];
  undefined1 local_c10 [16];
  undefined1 *local_c00 [2];
  undefined1 local_bf0 [16];
  undefined1 *local_be0 [2];
  undefined1 local_bd0 [16];
  undefined1 *local_bc0 [2];
  undefined1 local_bb0 [16];
  undefined1 *local_ba0 [2];
  undefined1 local_b90 [16];
  undefined1 *local_b80 [2];
  undefined1 local_b70 [16];
  undefined1 *local_b60 [2];
  undefined1 local_b50 [16];
  undefined1 *local_b40 [2];
  undefined1 local_b30 [16];
  undefined1 *local_b20 [2];
  undefined1 local_b10 [16];
  undefined1 *local_b00 [2];
  undefined1 local_af0 [16];
  undefined1 *local_ae0 [2];
  undefined1 local_ad0 [16];
  undefined1 *local_ac0 [2];
  undefined1 local_ab0 [16];
  undefined1 *local_aa0 [2];
  undefined1 local_a90 [16];
  undefined1 *local_a80 [2];
  undefined1 local_a70 [16];
  undefined1 *local_a60 [2];
  undefined1 local_a50 [16];
  undefined1 *local_a40 [2];
  undefined1 local_a30 [16];
  undefined1 *local_a20 [2];
  undefined1 local_a10 [16];
  undefined1 *local_a00 [2];
  undefined1 local_9f0 [16];
  undefined1 *local_9e0 [2];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0 [2];
  undefined1 local_9b0 [16];
  undefined1 *local_9a0 [2];
  undefined1 local_990 [16];
  undefined1 *local_980 [2];
  undefined1 local_970 [16];
  undefined1 *local_960 [2];
  undefined1 local_950 [16];
  undefined1 *local_940 [2];
  undefined1 local_930 [16];
  undefined1 *local_920 [2];
  undefined1 local_910 [16];
  undefined1 *local_900 [2];
  undefined1 local_8f0 [16];
  undefined1 *local_8e0 [2];
  undefined1 local_8d0 [16];
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  undefined1 *local_860 [2];
  undefined1 local_850 [16];
  undefined1 *local_840 [2];
  undefined1 local_830 [16];
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined1 *local_7c0 [2];
  undefined1 local_7b0 [16];
  undefined1 *local_7a0 [2];
  undefined1 local_790 [16];
  undefined1 *local_780 [2];
  undefined1 local_770 [16];
  undefined1 *local_760 [2];
  undefined1 local_750 [16];
  undefined1 *local_740 [2];
  undefined1 local_730 [16];
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  undefined1 *local_700 [2];
  undefined1 local_6f0 [16];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      local_1040[0] = local_1030;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1040,"main","");
      local_1020[0] = local_1010;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"fragment","");
      local_1000[0] = local_ff0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1000,"vertex","");
      local_fe0[0] = local_fd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"kernel","");
      local_fc0[0] = local_fb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fc0,"saturate","");
      local_fa0[0] = local_f90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fa0,"assert","");
      local_f80[0] = local_f70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f80,"fmin3","");
      local_f60[0] = local_f50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,"fmax3","");
      local_f40[0] = local_f30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f40,"divide","");
      local_f20[0] = local_f10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f20,"fmod","");
      local_f00[0] = local_ef0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"median3","");
      local_ee0[0] = local_ed0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ee0,"VARIABLE_TRACEPOINT","");
      local_ec0[0] = local_eb0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ec0,"STATIC_DATA_TRACEPOINT","");
      local_ea0[0] = local_e90;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ea0,"STATIC_DATA_TRACEPOINT_V","");
      local_e80[0] = local_e70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e80,"METAL_ALIGN","");
      local_e60[0] = local_e50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e60,"METAL_ASM","");
      local_e40[0] = local_e30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e40,"METAL_CONST","");
      local_e20[0] = local_e10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e20,"METAL_DEPRECATED","");
      local_e00[0] = local_df0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e00,"METAL_ENABLE_IF","");
      local_de0[0] = local_dd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_de0,"METAL_FUNC","");
      local_dc0[0] = local_db0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_dc0,"METAL_INTERNAL","");
      local_da0[0] = local_d90;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_da0,"METAL_NON_NULL_RETURN","");
      local_d80[0] = local_d70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d80,"METAL_NORETURN","");
      local_d60[0] = local_d50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d60,"METAL_NOTHROW","");
      local_d40[0] = local_d30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,"METAL_PURE","");
      local_d20[0] = local_d10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d20,"METAL_UNAVAILABLE","");
      local_d00[0] = local_cf0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d00,"METAL_IMPLICIT","");
      local_ce0[0] = local_cd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ce0,"METAL_EXPLICIT","");
      local_cc0[0] = local_cb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"METAL_CONST_ARG","");
      local_ca0[0] = local_c90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ca0,"METAL_ARG_UNIFORM","");
      local_c80[0] = local_c70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c80,"METAL_ZERO_ARG","");
      local_c60[0] = local_c50;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c60,"METAL_VALID_LOD_ARG","");
      local_c40[0] = local_c30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c40,"METAL_VALID_LEVEL_ARG","");
      local_c20[0] = local_c10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c20,"METAL_VALID_STORE_ORDER","");
      local_c00[0] = local_bf0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c00,"METAL_VALID_LOAD_ORDER","");
      local_be0[0] = local_bd0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_be0,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER","");
      local_bc0[0] = local_bb0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_bc0,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS","");
      local_ba0[0] = local_b90;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ba0,"METAL_VALID_RENDER_TARGET","");
      local_b80[0] = local_b70;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b80,"is_function_constant_defined","");
      local_b60[0] = local_b50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"CHAR_BIT","");
      local_b40[0] = local_b30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"SCHAR_MAX","");
      local_b20[0] = local_b10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b20,"SCHAR_MIN","");
      local_b00[0] = local_af0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b00,"UCHAR_MAX","");
      local_ae0[0] = local_ad0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"CHAR_MAX","");
      local_ac0[0] = local_ab0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"CHAR_MIN","");
      local_aa0[0] = local_a90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_aa0,"USHRT_MAX","");
      local_a80[0] = local_a70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"SHRT_MAX","");
      local_a60[0] = local_a50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"SHRT_MIN","");
      local_a40[0] = local_a30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"UINT_MAX","");
      local_a20[0] = local_a10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a20,"INT_MAX","");
      local_a00[0] = local_9f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"INT_MIN","");
      local_9e0[0] = local_9d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9e0,"FLT_DIG","");
      local_9c0[0] = local_9b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9c0,"FLT_MANT_DIG","");
      local_9a0[0] = local_990;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"FLT_MAX_10_EXP","");
      local_980[0] = local_970;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"FLT_MAX_EXP","");
      local_960[0] = local_950;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"FLT_MIN_10_EXP","");
      local_940[0] = local_930;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"FLT_MIN_EXP","");
      local_920[0] = local_910;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"FLT_RADIX","");
      local_900[0] = local_8f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"FLT_MAX","");
      local_8e0[0] = local_8d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8e0,"FLT_MIN","");
      local_8c0[0] = local_8b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"FLT_EPSILON","");
      local_8a0[0] = local_890;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,"FP_ILOGB0","");
      local_880[0] = local_870;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"FP_ILOGBNAN","");
      local_860[0] = local_850;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_860,"MAXFLOAT","");
      local_840[0] = local_830;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"HUGE_VALF","");
      local_820[0] = local_810;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"INFINITY","");
      local_800[0] = local_7f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"NAN","");
      local_7e0[0] = local_7d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"M_E_F","");
      local_7c0[0] = local_7b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"M_LOG2E_F","");
      local_7a0[0] = local_790;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"M_LOG10E_F","");
      local_780[0] = local_770;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"M_LN2_F","");
      local_760[0] = local_750;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"M_LN10_F","");
      local_740[0] = local_730;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"M_PI_F","");
      local_720[0] = local_710;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"M_PI_2_F","");
      local_700[0] = local_6f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"M_PI_4_F","");
      local_6e0[0] = local_6d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"M_1_PI_F","");
      local_6c0[0] = local_6b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"M_2_PI_F","");
      local_6a0[0] = local_690;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"M_2_SQRTPI_F","");
      local_680[0] = local_670;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"M_SQRT2_F","");
      local_660[0] = local_650;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"M_SQRT1_2_F","");
      local_640[0] = local_630;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"HALF_DIG","");
      local_620[0] = local_610;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"HALF_MANT_DIG","");
      local_600[0] = local_5f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"HALF_MAX_10_EXP","");
      local_5e0[0] = local_5d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"HALF_MAX_EXP","");
      local_5c0[0] = local_5b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"HALF_MIN_10_EXP","");
      local_5a0[0] = local_590;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"HALF_MIN_EXP","");
      local_580[0] = local_570;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"HALF_RADIX","");
      local_560[0] = local_550;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"HALF_MAX","");
      local_540[0] = local_530;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"HALF_MIN","");
      local_520[0] = local_510;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"HALF_EPSILON","");
      local_500[0] = local_4f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"MAXHALF","");
      local_4e0[0] = local_4d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"HUGE_VALH","");
      local_4c0[0] = local_4b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"M_E_H","");
      local_4a0[0] = local_490;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"M_LOG2E_H","");
      local_480[0] = local_470;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"M_LOG10E_H","");
      local_460[0] = local_450;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"M_LN2_H","");
      local_440[0] = local_430;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"M_LN10_H","");
      local_420[0] = local_410;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"M_PI_H","");
      local_400[0] = local_3f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"M_PI_2_H","");
      local_3e0[0] = local_3d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"M_PI_4_H","");
      local_3c0[0] = local_3b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"M_1_PI_H","");
      local_3a0[0] = local_390;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"M_2_PI_H","");
      local_380[0] = local_370;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"M_2_SQRTPI_H","");
      local_360[0] = local_350;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"M_SQRT2_H","");
      local_340[0] = local_330;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"M_SQRT1_2_H","");
      local_320[0] = local_310;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"DBL_DIG","");
      local_300[0] = local_2f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"DBL_MANT_DIG","");
      local_2e0[0] = local_2d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"DBL_MAX_10_EXP","");
      local_2c0[0] = local_2b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"DBL_MAX_EXP","");
      local_2a0[0] = local_290;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"DBL_MIN_10_EXP","");
      local_280[0] = local_270;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DBL_MIN_EXP","");
      local_260[0] = local_250;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"DBL_RADIX","");
      local_240[0] = local_230;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"DBL_MAX","");
      local_220[0] = local_210;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"DBL_MIN","");
      local_200[0] = local_1f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"DBL_EPSILON","");
      local_1e0[0] = local_1d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"HUGE_VAL","");
      local_1c0[0] = local_1b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"M_E","");
      local_1a0[0] = local_190;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"M_LOG2E","");
      local_180[0] = local_170;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"M_LOG10E","");
      local_160[0] = local_150;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"M_LN2","");
      local_140[0] = local_130;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"M_LN10","");
      local_120[0] = local_110;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"M_PI","");
      local_100[0] = local_f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"M_PI_2","");
      local_e0[0] = local_d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"M_PI_4","");
      local_c0[0] = local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"M_1_PI","");
      local_a0[0] = local_90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"M_2_PI","");
      local_80[0] = local_70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"M_2_SQRTPI","");
      local_60[0] = local_50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"M_SQRT2","");
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"M_SQRT1_2","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,local_1040,
                 &stack0xffffffffffffffe0,0,&local_1041,&local_1042,&local_1043);
      lVar2 = 0;
      do {
        if (local_30 + lVar2 != *(undefined1 **)((long)local_40 + lVar2)) {
          operator_delete(*(undefined1 **)((long)local_40 + lVar2));
        }
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x1020);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_);
    }
  }
  return &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_illegal_func_names()
{
	static const unordered_set<string> illegal_func_names = {
		"main",
		"fragment",
		"vertex",
		"kernel",
		"saturate",
		"assert",
		"fmin3",
		"fmax3",
		"divide",
		"fmod",
		"median3",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
	};

	return illegal_func_names;
}